

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

void __thiscall
Js::JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
          (AutoCatchHandlerExists *this,ScriptContext *scriptContext,bool isPromiseHandled)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *pTVar4;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x2d,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00a94a9f;
    *puVar3 = 0;
  }
  pTVar4 = scriptContext->threadContext;
  this->m_threadContext = pTVar4;
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x2f,"(m_threadContext)","m_threadContext");
    if (!bVar2) {
LAB_00a94a9f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pTVar4 = this->m_threadContext;
  }
  this->m_previousCatchHandlerExists = pTVar4->hasCatchHandler;
  pTVar4->hasCatchHandler = isPromiseHandled;
  this->m_previousCatchHandlerToUserCodeStatus = pTVar4->hasCatchHandlerToUserCode;
  bVar2 = ScriptContext::IsScriptContextInDebugMode(scriptContext);
  if (bVar2) {
    FetchNonUserCodeStatus(this,scriptContext);
    return;
  }
  return;
}

Assistant:

JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists(ScriptContext* scriptContext, bool isPromiseHandled)
    {
        Assert(scriptContext);
        m_threadContext = scriptContext->GetThreadContext();
        Assert(m_threadContext);
        m_previousCatchHandlerExists = m_threadContext->HasCatchHandler();
        m_threadContext->SetHasCatchHandler(TRUE);

        if (!isPromiseHandled)
        {
            // If this is created from a promise-specific code path, and we don't have a rejection
            // handler on the promise, then we want SetCatchHandler to be false so we report any
            // unhandled exceptions to any detached debuggers.
            m_threadContext->SetHasCatchHandler(false);
        }

        m_previousCatchHandlerToUserCodeStatus = m_threadContext->IsUserCode();
        if (scriptContext->IsScriptContextInDebugMode())
        {
            FetchNonUserCodeStatus(scriptContext);
        }
    }